

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

void __thiscall pbrt::syntactic::Token::Token(Token *this,Loc *loc,Type type,string *text)

{
  string *in_RCX;
  undefined4 in_EDX;
  Loc *in_RDI;
  Loc *in_stack_ffffffffffffffd0;
  
  Loc::Loc(in_stack_ffffffffffffffd0,in_RDI);
  *(undefined4 *)
   &in_RDI[1].file.super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_EDX;
  std::__cxx11::string::string
            ((string *)
             &in_RDI[1].file.super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,in_RCX);
  return;
}

Assistant:

Token(const Loc &loc, const Type type, const std::string& text) : loc{loc}, type{type}, text{text} { }